

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2tt.cpp
# Opt level: O0

bool IsSegmentApproximationClose(double tmin,double tmax,Coeff2 coeff,SegmentQ s,double error)

{
  SegmentQ s_00;
  Coeff2 coeff_00;
  double dVar1;
  double dVar2;
  Point PVar3;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  double dStack_a8;
  double local_a0;
  double local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  double dStack_58;
  double local_50;
  Point p;
  double t;
  double dt;
  int n;
  double error_local;
  double tmax_local;
  double tmin_local;
  
  dVar1 = (tmax - tmin) / 4.0;
  p.y = tmin + dVar1;
  while( true ) {
    dVar2 = p.y;
    if (tmax - 1e-06 <= p.y) {
      return true;
    }
    memcpy(&local_90,&coeff,0x40);
    coeff_00._M_elems[0].y = (double)uStack_88;
    coeff_00._M_elems[0].x = (double)local_90;
    coeff_00._M_elems[1].x = (double)local_80;
    coeff_00._M_elems[1].y = (double)uStack_78;
    coeff_00._M_elems[2].x = (double)local_70;
    coeff_00._M_elems[2].y = (double)uStack_68;
    coeff_00._M_elems[3].x = (double)local_60;
    coeff_00._M_elems[3].y = dStack_58;
    PVar3 = CalcPoint(dVar2,coeff_00);
    local_a0 = PVar3.x;
    local_98 = PVar3.y;
    local_50 = local_a0;
    p.x = local_98;
    memcpy(&local_d0,&s,0x30);
    PVar3.y = local_98;
    PVar3.x = local_a0;
    s_00._M_elems[0].y = (double)uStack_c8;
    s_00._M_elems[0].x = (double)local_d0;
    s_00._M_elems[1].x = (double)local_c0;
    s_00._M_elems[1].y = (double)uStack_b8;
    s_00._M_elems[2].x = (double)local_b0;
    s_00._M_elems[2].y = dStack_a8;
    dVar2 = MinDistanceToQuad(PVar3,s_00);
    if (error < dVar2) break;
    p.y = dVar1 + p.y;
  }
  return false;
}

Assistant:

bool IsSegmentApproximationClose(double tmin, double tmax, Coeff2 coeff,
                                 SegmentQ s, double error)
{
	int n = 4;
	double dt = (tmax - tmin) / n;
	for (double t = tmin + dt; t < tmax - 1e-6; t += dt)
	{
		Point p = CalcPoint(t, coeff);
		if (MinDistanceToQuad(p, s) > error)
			return false;
	}
	return true;
}